

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

int tsbp::parseLine(char *line)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *__nptr;
  
  sVar3 = strlen(line);
  __nptr = line + -1;
  do {
    pcVar1 = __nptr + 1;
    __nptr = __nptr + 1;
  } while ((byte)(*pcVar1 - 0x3aU) < 0xf6);
  line[(int)sVar3 + -3] = '\0';
  iVar2 = atoi(__nptr);
  return iVar2;
}

Assistant:

int parseLine(char* line)
    {
        // This assumes that a digit will be found and the line ends in " Kb".
        int i = strlen(line);
        const char* p = line;
        while (*p < '0' || *p > '9')
            p++;

        line[i - 3] = '\0';
        i = atoi(p);

        return i;
    }